

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

string * __thiscall
leveldb::Status::ToString_abi_cxx11_(string *__return_storage_ptr__,Status *this)

{
  uint uVar1;
  char *__s;
  allocator local_39;
  char tmp [30];
  
  if (this->state_ == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"OK",(allocator *)tmp);
  }
  else {
    uVar1 = (uint)this->state_[4];
    if (uVar1 < 6) {
      __s = &DAT_0010a7e0 + *(int *)(&DAT_0010a7e0 + ((ulong)uVar1 & 0xff) * 4);
    }
    else {
      __s = tmp;
      snprintf(__s,0x1e,"Unknown code(%d): ");
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,__s,&local_39);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)(this->state_ + 5));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToString() const {
  if (state_ == nullptr) {
    return "OK";
  } else {
    char tmp[30];
    const char* type;
    switch (code()) {
      case kOk:
        type = "OK";
        break;
      case kNotFound:
        type = "NotFound: ";
        break;
      case kCorruption:
        type = "Corruption: ";
        break;
      case kNotSupported:
        type = "Not implemented: ";
        break;
      case kInvalidArgument:
        type = "Invalid argument: ";
        break;
      case kIOError:
        type = "IO error: ";
        break;
      default:
        snprintf(tmp, sizeof(tmp),
                 "Unknown code(%d): ", static_cast<int>(code()));
        type = tmp;
        break;
    }
    std::string result(type);
    uint32_t length;
    memcpy(&length, state_, sizeof(length));
    result.append(state_ + 5, length);
    return result;
  }
}